

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

ll_elem * succ(ll_head *q_head,ll_elem *n)

{
  long *plVar1;
  int iVar2;
  ll_elem *in_RAX;
  ll_head *q_head_00;
  ll_elem *plVar3;
  size_t count;
  size_t count_00;
  size_t count_01;
  elem_ptr_t *ptr;
  ll_head *q_head_01;
  ll_elem *s_;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x10e,
                  "struct ll_elem *succ(struct ll_head *, struct ll_elem *)");
  }
  ptr = (elem_ptr_t *)((ulong)n & 0xfffffffffffffffc);
  if (ptr == (elem_ptr_t *)0x0) {
    __assert_fail("n != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x110,
                  "struct ll_elem *succ(struct ll_head *, struct ll_elem *)");
  }
  s_ = in_RAX;
  q_head_00 = (ll_head *)deref(ptr);
  if ((ll_head *)0x3 < q_head_00) {
    while ((((elem_ptr_t *)((ulong)q_head_00 & 0xfffffffffffffffc))[1] & 2) != 0) {
      plVar3 = deref((elem_ptr_t *)((ulong)q_head_00 & 0xfffffffffffffffc));
      q_head_01 = (ll_head *)((ulong)((uint)q_head_00 & 2) | (ulong)plVar3 & 0xfffffffffffffffc);
      s_ = &q_head_00->q;
      iVar2 = ptr_cas(ptr,&s_,(ll_elem *)q_head_01);
      if (iVar2 == 0) {
        deref_release(q_head_00,(ll_elem *)0x1,count);
        deref_release(q_head_01,(ll_elem *)0x1,count_01);
        q_head_00 = (ll_head *)deref(ptr);
      }
      else {
        LOCK();
        plVar1 = (long *)(((ulong)plVar3 & 0xfffffffffffffffc) + 0x10);
        *plVar1 = *plVar1 + 1;
        UNLOCK();
        ptr_clear_deref(ptr);
        deref_release(q_head_00,(ll_elem *)0x2,count_00);
        q_head_00 = q_head_01;
      }
    }
  }
  return &q_head_00->q;
}

Assistant:

static struct ll_elem*
succ(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*q, *s, *s_, *ss;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	n = ptr_clear(n);
	assert(n != NULL);

	s = deref(&n->succ);
	/* If s is null, n is not on the queue. */
	if (ptr_clear(s) == NULL)
		return s;

	while (deleted(s)) {
		ss = flag_combine(deref(&ptr_clear(s)->succ), s);
		s_ = s;
		if (ptr_cas(&n->succ, &s_, ss)) {
			/* cas succeeded */
			deref_acquire(ss, 1);
			ptr_clear_deref(&n->succ);

			/* Release s:
			 * - once for n->succ
			 * - once because we no longer claim s.
			 */
			deref_release(q_head, s, 2);
			s = ss;
		} else {
			/* cas failed */
			deref_release(q_head, s, 1);
			deref_release(q_head, ss, 1);

			/*
			 * Cannot do s = s_, since we do not have the lock on
			 * n->succ at the moment and thus cannot acquire the
			 * reference counter on s_.
			 */
			s = deref(&n->succ);
		}
	}

	return s;
}